

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsParseModuleSource(JsModuleRecord requestModule,JsSourceContext sourceContext,byte *sourceText,
                   uint sourceLength,JsParseModuleSourceFlags sourceFlag,
                   JsValueRef *exceptionValueRef)

{
  anon_class_64_8_a783035d fn;
  bool bVar1;
  ScriptContext *pSStack_50;
  JsErrorCode errorCode;
  ScriptContext *scriptContext;
  SourceTextModuleRecord *moduleRecord;
  JsValueRef *ppvStack_38;
  HRESULT hr;
  JsValueRef *exceptionValueRef_local;
  JsParseModuleSourceFlags sourceFlag_local;
  uint sourceLength_local;
  byte *sourceText_local;
  JsSourceContext sourceContext_local;
  JsModuleRecord requestModule_local;
  
  if (requestModule == (JsModuleRecord)0x0) {
    requestModule_local._4_4_ = JsErrorNullArgument;
  }
  else if (exceptionValueRef == (JsValueRef *)0x0) {
    requestModule_local._4_4_ = JsErrorNullArgument;
  }
  else if ((int)sourceFlag < 2) {
    *exceptionValueRef = (JsValueRef)0x0;
    ppvStack_38 = exceptionValueRef;
    exceptionValueRef_local._0_4_ = sourceFlag;
    exceptionValueRef_local._4_4_ = sourceLength;
    _sourceFlag_local = sourceText;
    sourceText_local = (byte *)sourceContext;
    sourceContext_local = (JsSourceContext)requestModule;
    bVar1 = Js::SourceTextModuleRecord::Is(requestModule);
    if (bVar1) {
      scriptContext =
           (ScriptContext *)Js::SourceTextModuleRecord::FromHost((void *)sourceContext_local);
      bVar1 = Js::SourceTextModuleRecord::WasParsed((SourceTextModuleRecord *)scriptContext);
      if (bVar1) {
        requestModule_local._4_4_ = JsErrorModuleParsed;
      }
      else {
        pSStack_50 = Js::SourceTextModuleRecord::GetScriptContext
                               ((SourceTextModuleRecord *)scriptContext);
        fn.sourceContext = (JsSourceContext *)&scriptContext;
        fn.scriptContext = (ScriptContext **)&sourceText_local;
        fn.moduleRecord = (SourceTextModuleRecord **)((long)&exceptionValueRef_local + 4);
        fn.sourceLength = (uint *)((long)&moduleRecord + 4);
        fn.hr = (HRESULT *)&sourceFlag_local;
        fn.sourceText = (byte **)&stack0xffffffffffffffc8;
        fn.exceptionValueRef = &exceptionValueRef_local;
        fn.sourceFlag = (JsParseModuleSourceFlags *)&stack0xffffffffffffffb0;
        requestModule_local._4_4_ = GlobalAPIWrapper_NoRecord<JsParseModuleSource::__0>(fn);
      }
    }
    else {
      requestModule_local._4_4_ = JsErrorInvalidArgument;
    }
  }
  else {
    requestModule_local._4_4_ = JsErrorInvalidArgument;
  }
  return requestModule_local._4_4_;
}

Assistant:

CHAKRA_API
JsParseModuleSource(
    _In_ JsModuleRecord requestModule,
    _In_ JsSourceContext sourceContext,
    _In_ byte* sourceText,
    _In_ unsigned int sourceLength,
    _In_ JsParseModuleSourceFlags sourceFlag,
    _Outptr_result_maybenull_ JsValueRef* exceptionValueRef)
{
    PARAM_NOT_NULL(requestModule);
    PARAM_NOT_NULL(exceptionValueRef);
    if (sourceFlag > JsParseModuleSourceFlags_DataIsUTF8)
    {
        return JsErrorInvalidArgument;
    }

    *exceptionValueRef = JS_INVALID_REFERENCE;
    HRESULT hr;
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        return JsErrorInvalidArgument;
    }
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    if (moduleRecord->WasParsed())
    {
        return JsErrorModuleParsed;
    }
    Js::ScriptContext* scriptContext = moduleRecord->GetScriptContext();
    JsErrorCode errorCode = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        SourceContextInfo* sourceContextInfo = scriptContext->GetSourceContextInfo(sourceContext, nullptr);
        if (sourceContextInfo == nullptr)
        {
            const char16 *moduleUrlSz = nullptr;
            size_t moduleUrlLen = 0;
            if (moduleRecord->GetSpecifier())
            {
                Js::JavascriptString *moduleUrl = Js::VarTo<Js::JavascriptString>(moduleRecord->GetSpecifier());
                moduleUrlSz = moduleUrl->GetSz();
                moduleUrlLen = moduleUrl->GetLength();
            }
            sourceContextInfo = scriptContext->CreateSourceContextInfo(sourceContext, moduleUrlSz, moduleUrlLen, nullptr, nullptr, 0);
        }
        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(sourceLength),
            /* ulCharOffset        */ 0,
            /* mod                 */ 0,
            /* grfsi               */ 0
        };
        hr = moduleRecord->ParseSource(sourceText, sourceLength, &si, exceptionValueRef, sourceFlag == JsParseModuleSourceFlags_DataIsUTF8 ? true : false);
        if (FAILED(hr))
        {
            return JsErrorScriptCompile;
        }
        return JsNoError;
    });
    return errorCode;
}